

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

SpirVSource * __thiscall xe::ri::List::allocItem<xe::ri::SpirVSource>(List *this)

{
  SpirVSource *pSVar1;
  SpirVSource *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pSVar1 = (SpirVSource *)operator_new(0x30);
  (pSVar1->super_Item).m_type = TYPE_SPIRVSOURCE;
  (pSVar1->super_Item)._vptr_Item = (_func_int **)&PTR__SpirVSource_00128718;
  (pSVar1->source)._M_dataplus._M_p = (pointer)&(pSVar1->source).field_2;
  (pSVar1->source)._M_string_length = 0;
  (pSVar1->source).field_2._M_local_buf[0] = '\0';
  local_18 = pSVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pSVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}